

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

string * __thiscall
LiteScript::_Type_CHARACTER::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_CHARACTER *this,Variable *obj)

{
  char32_t c;
  Object *pOVar1;
  String local_30;
  
  pOVar1 = Variable::operator->(obj);
  c = Character::operator_cast_to_char32_t((Character *)pOVar1->data);
  String::String(&local_30,c);
  String::operator_cast_to_string(__return_storage_ptr__,&local_30);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_CHARACTER::ToString(const LiteScript::Variable& obj) const {
    return String(obj->GetData<Character>());
}